

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mstring.c
# Opt level: O1

int strnscmp(char *a,char *b)

{
  char *pcVar1;
  ushort *puVar2;
  ushort **ppuVar3;
  char cVar4;
  
  ppuVar3 = __ctype_b_loc();
  puVar2 = *ppuVar3;
  do {
    while( true ) {
      a = a + -1;
      do {
        pcVar1 = a + 1;
        a = a + 1;
      } while ((*(byte *)((long)puVar2 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
      b = b + -1;
      do {
        pcVar1 = b + 1;
        b = b + 1;
      } while ((*(byte *)((long)puVar2 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
      cVar4 = *a;
      while ((cVar4 != '\0' && (cVar4 == *b))) {
        b = b + 1;
        pcVar1 = a + 1;
        a = a + 1;
        cVar4 = *pcVar1;
      }
      if ((puVar2[cVar4] >> 0xd & 1) != 0) break;
      if (((*(byte *)((long)puVar2 + (long)*b * 2 + 1) & 0x20) == 0) ||
         (((puVar2[cVar4] & 8) != 0 && ((puVar2[b[-1]] & 8) != 0)))) goto LAB_0011289c;
    }
  } while (((puVar2[a[-1]] & 8) == 0) || ((puVar2[*b] & 8) == 0));
LAB_0011289c:
  return (int)cVar4 - (int)*b;
}

Assistant:

int strnscmp(const char *a, const char *b)
{
    while(1) {
	while (isspace(*a)) a++;
	while (isspace(*b)) b++;
	while (*a && *a == *b) a++,b++;
	if (isspace(*a)) {
	    if (isalnum(a[-1]) && isalnum(*b))
		break; }
	else if (isspace(*b)) {
	    if (isalnum(b[-1]) && isalnum(*a))
		break; }
	else
	    break; }
    return *a - *b;
}